

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  U32 *pUVar3;
  int iVar4;
  char cVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  int *piVar13;
  int *piVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  uint uVar17;
  seqDef *psVar18;
  ulong uVar19;
  BYTE *pBVar20;
  int *piVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  int *piVar25;
  U32 UVar26;
  ulong uVar27;
  size_t offbaseFound;
  size_t local_d8;
  uint local_d0;
  uint local_cc;
  int *local_c8;
  uint local_bc;
  BYTE *local_b8;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  int *local_90;
  uint local_84;
  seqStore_t *local_80;
  int *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  BYTE *local_50;
  int *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  local_bc = (ms->cParams).minMatch;
  if (5 < local_bc) {
    local_bc = 6;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_cc = 6;
  if (local_94 < 6) {
    local_cc = local_94;
  }
  uVar9 = (ms->window).dictLimit;
  local_a8 = (ulong)uVar9;
  if (local_cc < 5) {
    local_cc = 4;
  }
  local_68 = local_b8 + local_a8;
  pZVar2 = ms->dictMatchState;
  local_60 = (pZVar2->window).base;
  local_40 = local_60 + (pZVar2->window).dictLimit;
  local_70 = (int *)(pZVar2->window).nextSrc;
  uVar8 = ((int)src - ((int)local_40 + (int)local_68)) + (int)local_70;
  piVar25 = (int *)((long)src + (ulong)(uVar8 == 0));
  local_d0 = *rep;
  local_80 = seqStore;
  if (uVar8 < local_d0) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_ac = rep[1];
  local_58 = rep;
  if (uVar8 < local_ac) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_90 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar8 = ms->nextToUpdate;
  uVar19 = (ulong)uVar8;
  uVar17 = ((int)local_90 - (int)(local_b8 + uVar19)) + 1;
  uVar23 = 8;
  if (uVar17 < 8) {
    uVar23 = uVar17;
  }
  if (local_90 < local_b8 + uVar19) {
    uVar23 = 0;
  }
  bVar12 = (byte)local_cc;
  if (uVar8 < uVar23 + uVar8) {
    local_c8 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_00180b06:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar20 = ms->tagTable;
    uVar11 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_bc == 5) {
        uVar27 = *(long *)(local_b8 + uVar19) * -0x30e4432345000000;
LAB_0017fe1f:
        uVar27 = (uVar27 ^ uVar11) >> (0x38U - cVar5 & 0x3f);
      }
      else {
        if (local_bc == 6) {
          uVar27 = *(long *)(local_b8 + uVar19) * -0x30e4432340650000;
          goto LAB_0017fe1f;
        }
        uVar27 = (ulong)((*(int *)(local_b8 + uVar19) * -0x61c8864f ^ (uint)uVar11) >>
                        (0x18U - cVar5 & 0x1f));
      }
      uVar17 = ((uint)(uVar27 >> 8) & 0xffffff) << (bVar12 & 0x1f);
      if (((ulong)(pUVar3 + uVar17) & 0x3f) != 0) {
LAB_00180a2d:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar20 + uVar17) & ~(-1L << (bVar12 & 0x3f))) != 0) {
LAB_00180a0e:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar19 & 7] = (U32)uVar27;
      uVar19 = uVar19 + 1;
    } while (uVar23 + uVar8 != uVar19);
  }
  local_c8 = (int *)(srcSize + (long)src);
  if (piVar25 < local_90) {
    local_84 = ((int)local_60 - (int)local_70) + uVar9;
    local_50 = local_60 + -(ulong)local_84;
    local_48 = local_c8 + -8;
    local_38 = ~(-1L << (bVar12 & 0x3f));
    do {
      uVar9 = local_bc;
      uVar8 = (((int)piVar25 - (int)local_b8) - local_d0) + 1;
      piVar21 = (int *)(local_b8 + uVar8);
      if (uVar8 < (uint)local_a8) {
        piVar21 = (int *)(local_60 + (uVar8 - local_84));
      }
      if ((uVar8 - (uint)local_a8 < 0xfffffffd) && (*piVar21 == *(int *)((long)piVar25 + 1))) {
        piVar13 = local_c8;
        if (uVar8 < (uint)local_a8) {
          piVar13 = local_70;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar21 + 1),(BYTE *)local_c8,
                            (BYTE *)piVar13,local_68);
        uVar19 = sVar10 + 4;
      }
      else {
        uVar19 = 0;
      }
      local_d8 = 999999999;
      if (uVar9 == 6) {
        if (local_cc == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
        else if (local_cc == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
      }
      else if (uVar9 == 5) {
        if (local_cc == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
        else if (local_cc == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
        }
      }
      else if (local_cc == 6) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
      }
      else if (local_cc == 5) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (ms,(BYTE *)piVar25,(BYTE *)local_c8,&local_d8);
      }
      uVar27 = uVar19;
      if (uVar19 < uVar11) {
        uVar27 = uVar11;
      }
      if (uVar27 < 4) {
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar25 - (long)src));
        piVar25 = (int *)((long)piVar25 + ((ulong)((long)piVar25 - (long)src) >> 8) + 1);
      }
      else {
        local_78 = piVar25;
        local_a0 = local_d8;
        if (uVar11 <= uVar19) {
          local_78 = (int *)((long)piVar25 + 1);
          local_a0 = 1;
        }
        if (piVar25 < local_90) {
          do {
            uVar9 = local_bc;
            piVar21 = (int *)((long)piVar25 + 1);
            uVar8 = ((int)piVar21 - (int)local_b8) - local_d0;
            piVar13 = (int *)(local_b8 + uVar8);
            if (uVar8 < (uint)local_a8) {
              piVar13 = (int *)(local_60 + (uVar8 - local_84));
            }
            if ((uVar8 - (uint)local_a8 < 0xfffffffd) && (*piVar13 == *piVar21)) {
              piVar14 = local_c8;
              if (uVar8 < (uint)local_a8) {
                piVar14 = local_70;
              }
              sVar10 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar13 + 1),(BYTE *)local_c8
                                  ,(BYTE *)piVar14,local_68);
              if (sVar10 < 0xfffffffffffffffc) {
                uVar8 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)uVar27 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                  local_a0 = 1;
                  uVar27 = sVar10 + 4;
                  local_78 = piVar21;
                }
              }
            }
            local_d8 = 999999999;
            if (uVar9 == 6) {
              if (local_cc == 6) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (uVar9 == 5) {
              if (local_cc == 6) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (local_cc == 6) {
              uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                 (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
            }
            else if (local_cc == 5) {
              uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                 (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
            }
            else {
              uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                 (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
            }
            uVar9 = local_bc;
            if (uVar19 < 4) {
LAB_001802ce:
              if (local_90 <= piVar21) break;
              piVar21 = (int *)((long)piVar25 + 2);
              uVar8 = ((int)piVar21 - (int)local_b8) - local_d0;
              piVar13 = (int *)(local_b8 + uVar8);
              if (uVar8 < (uint)local_a8) {
                piVar13 = (int *)(local_60 + (uVar8 - local_84));
              }
              if ((uVar8 - (uint)local_a8 < 0xfffffffd) && (*piVar13 == *piVar21)) {
                piVar14 = local_c8;
                if (uVar8 < (uint)local_a8) {
                  piVar14 = local_70;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 6),(BYTE *)(piVar13 + 1),
                                    (BYTE *)local_c8,(BYTE *)piVar14,local_68);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar8 = 0x1f;
                  if ((uint)local_a0 != 0) {
                    for (; (uint)local_a0 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + (int)uVar27 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                    local_a0 = 1;
                    uVar27 = sVar10 + 4;
                    local_78 = piVar21;
                  }
                }
              }
              local_d8 = 999999999;
              if (uVar9 == 6) {
                if (local_cc == 6) {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
                else if (local_cc == 5) {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (uVar9 == 5) {
                if (local_cc == 6) {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
                else if (local_cc == 5) {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                     (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (local_cc == 6) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else if (local_cc == 5) {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar19 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                   (ms,(BYTE *)piVar21,(BYTE *)local_c8,&local_d8);
              }
              if (uVar19 < 4) break;
              uVar9 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              iVar4 = 0x1f;
              if ((uint)local_d8 != 0) {
                for (; (uint)local_d8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)uVar19 * 4 - iVar4 <= (int)((uVar9 ^ 0x1f) + (int)uVar27 * 4 + -0x18)) break;
            }
            else {
              uVar8 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              iVar4 = 0x1f;
              if ((uint)local_d8 != 0) {
                for (; (uint)local_d8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              if ((int)uVar19 * 4 - iVar4 <= (int)((uVar8 ^ 0x1f) + (int)uVar27 * 4 + -0x1b))
              goto LAB_001802ce;
            }
            piVar25 = piVar21;
            uVar27 = uVar19;
            local_a0 = local_d8;
            local_78 = piVar25;
          } while (piVar25 < local_90);
        }
        UVar26 = (U32)local_a0;
        piVar25 = local_78;
        if (3 < local_a0) {
          pBVar15 = (BYTE *)((long)local_78 + (-(long)local_b8 - local_a0) + -0xfffffffd);
          pBVar16 = local_b8;
          pBVar20 = local_68;
          if ((uint)pBVar15 < (uint)local_a8) {
            pBVar16 = local_50;
            pBVar20 = local_40;
          }
          if ((src < local_78) && (uVar19 = (ulong)pBVar15 & 0xffffffff, pBVar20 < pBVar16 + uVar19)
             ) {
            pBVar16 = pBVar16 + uVar19;
            do {
              piVar21 = (int *)((long)piVar25 + -1);
              pBVar16 = pBVar16 + -1;
              if ((*(BYTE *)piVar21 != *pBVar16) ||
                 (uVar27 = uVar27 + 1, piVar25 = piVar21, piVar21 <= src)) break;
            } while (pBVar20 < pBVar16);
          }
          local_ac = local_d0;
          local_d0 = UVar26 - 3;
        }
        if (local_80->maxNbSeq <=
            (ulong)((long)local_80->sequences - (long)local_80->sequencesStart >> 3)) {
LAB_00180a8a:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_80->maxNbLit) {
LAB_00180a6b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar19 = (long)piVar25 - (long)src;
        pBVar20 = local_80->lit;
        if (local_80->litStart + local_80->maxNbLit < pBVar20 + uVar19) {
LAB_00180aa9:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c8 < piVar25) {
LAB_00180ac8:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < piVar25) {
          ZSTD_safecopyLiterals(pBVar20,(BYTE *)src,(BYTE *)piVar25,(BYTE *)local_48);
LAB_0018060a:
          local_80->lit = local_80->lit + uVar19;
          if (0xffff < uVar19) {
            if (local_80->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_80->longLengthType = ZSTD_llt_literalLength;
            local_80->longLengthPos =
                 (U32)((ulong)((long)local_80->sequences - (long)local_80->sequencesStart) >> 3);
          }
        }
        else {
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar20 = *src;
          *(undefined8 *)(pBVar20 + 8) = uVar6;
          pBVar20 = local_80->lit;
          if (0x10 < uVar19) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar20 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar6;
            if (0x20 < (long)uVar19) {
              lVar22 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar22 + 0x20);
                uVar6 = puVar1[1];
                pBVar16 = pBVar20 + lVar22 + 0x20;
                *(undefined8 *)pBVar16 = *puVar1;
                *(undefined8 *)(pBVar16 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar22 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar16 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                lVar22 = lVar22 + 0x20;
              } while (pBVar16 + 0x20 < pBVar20 + uVar19);
            }
            goto LAB_0018060a;
          }
          local_80->lit = pBVar20 + uVar19;
        }
        psVar7 = local_80;
        psVar18 = local_80->sequences;
        psVar18->litLength = (U16)uVar19;
        psVar18->offBase = UVar26;
        if (uVar27 < 3) {
LAB_00180a4c:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar27 - 3) {
          if (local_80->longLengthType != ZSTD_llt_none) {
LAB_00180ae7:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_80->longLengthType = ZSTD_llt_matchLength;
          local_80->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_80->sequencesStart) >> 3);
        }
        psVar18->mlBase = (U16)(uVar27 - 3);
        psVar18 = psVar18 + 1;
        local_80->sequences = psVar18;
        if (ms->lazySkipping != 0) {
          uVar9 = ms->nextToUpdate;
          uVar19 = (ulong)uVar9;
          uVar8 = ((int)local_90 - (int)(local_b8 + uVar19)) + 1;
          if (7 < uVar8) {
            uVar8 = 8;
          }
          if (local_90 < local_b8 + uVar19) {
            uVar8 = 0;
          }
          if (uVar9 < uVar8 + uVar9) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_00180b06;
            pUVar3 = ms->hashTable;
            pBVar20 = ms->tagTable;
            uVar11 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_bc == 5) {
                uVar24 = *(long *)(local_b8 + uVar19) * -0x30e4432345000000;
LAB_001807d0:
                uVar23 = (uint)((uVar24 ^ uVar11) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_bc == 6) {
                  uVar24 = *(long *)(local_b8 + uVar19) * -0x30e4432340650000;
                  goto LAB_001807d0;
                }
                uVar23 = (*(int *)(local_b8 + uVar19) * -0x61c8864f ^ (uint)uVar11) >>
                         (0x18U - cVar5 & 0x1f);
              }
              uVar17 = (uVar23 >> 8) << ((byte)local_cc & 0x1f);
              if (((ulong)(pUVar3 + uVar17) & 0x3f) != 0) goto LAB_00180a2d;
              if ((local_38 & (ulong)(pBVar20 + uVar17)) != 0) goto LAB_00180a0e;
              ms->hashCache[(uint)uVar19 & 7] = uVar23;
              uVar19 = uVar19 + 1;
            } while (uVar8 + uVar9 != uVar19);
          }
          ms->lazySkipping = 0;
        }
        src = (void *)((long)piVar25 + uVar27);
        piVar25 = (int *)src;
        if (src <= local_90) {
          do {
            uVar9 = local_d0;
            uVar8 = ((int)src - (int)local_b8) - local_ac;
            pBVar20 = local_b8;
            if (uVar8 < (uint)local_a8) {
              pBVar20 = local_50;
            }
            piVar25 = (int *)src;
            local_d0 = uVar9;
            if ((0xfffffffc < uVar8 - (uint)local_a8) || (*(int *)(pBVar20 + uVar8) != *src)) break;
            piVar25 = local_c8;
            if (uVar8 < (uint)local_a8) {
              piVar25 = local_70;
            }
            local_d0 = local_ac;
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar20 + uVar8) + 4),
                                (BYTE *)local_c8,(BYTE *)piVar25,local_68);
            if (psVar7->maxNbSeq <= (ulong)((long)psVar18 - (long)psVar7->sequencesStart >> 3))
            goto LAB_00180a8a;
            if (0x20000 < psVar7->maxNbLit) goto LAB_00180a6b;
            pBVar20 = psVar7->lit;
            if (psVar7->litStart + psVar7->maxNbLit < pBVar20) goto LAB_00180aa9;
            if (local_c8 < src) goto LAB_00180ac8;
            if (local_48 < src) {
              ZSTD_safecopyLiterals(pBVar20,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar20 = *src;
              *(undefined8 *)(pBVar20 + 8) = uVar6;
            }
            psVar18 = psVar7->sequences;
            psVar18->litLength = 0;
            psVar18->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_00180a4c;
            if (0xffff < sVar10 + 1) {
              if (psVar7->longLengthType != ZSTD_llt_none) goto LAB_00180ae7;
              psVar7->longLengthType = ZSTD_llt_matchLength;
              psVar7->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)psVar7->sequencesStart) >> 3);
            }
            psVar18->mlBase = (U16)(sVar10 + 1);
            psVar18 = psVar18 + 1;
            psVar7->sequences = psVar18;
            src = (void *)((long)src + sVar10 + 4);
            piVar25 = (int *)src;
            local_ac = uVar9;
          } while (src <= local_90);
        }
      }
    } while (piVar25 < local_90);
  }
  *local_58 = local_d0;
  local_58[1] = local_ac;
  return (long)local_c8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dedicatedDictSearch);
}